

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar1;
  cmGeneratorTarget *target_00;
  cmTarget *__p;
  bool bVar2;
  cmValue cVar3;
  cmake *pcVar4;
  cmMakefile *mf;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar8;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  parentDagChecker;
  cmTarget dummyHead;
  cmGeneratorTarget *target;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  cmGeneratorTarget *local_c00;
  cmGeneratorExpression local_bf8;
  string *local_be0;
  cmGeneratorTarget *local_bd8;
  string *local_bd0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_bc8;
  undefined1 local_bb0 [56];
  string local_b78;
  cmGeneratorExpressionDAGChecker local_b58;
  cmGeneratorTarget local_ad8;
  
  local_c00 = tgt;
  local_bd0 = language;
  cVar3 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (cVar3.Value == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_be0 = __return_storage_ptr__;
    pcVar4 = cmMakefile::GetCMakeInstance(tgt->Makefile);
    local_bc8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_bc8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_bc8);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_bb0,pcVar4,(cmListFileBacktrace *)&local_bc8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_bc8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    bVar2 = std::operator==(propName,"INTERFACE_LINK_OPTIONS");
    if (bVar2) {
      local_b58.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
      local_bf8.CMakeInstance = (cmake *)0x0;
      std::
      make_unique<cmGeneratorExpressionDAGChecker,cmGeneratorTarget_const*&,char_const(&)[13],decltype(nullptr),decltype(nullptr)>
                ((cmGeneratorTarget **)&local_ad8,(char (*) [13])&local_c00,(void **)0x69e9f7,
                 &local_b58.Parent);
      __p = local_ad8.Target;
      local_ad8.Target = (cmTarget *)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
               *)&local_bf8.Backtrace,(pointer)__p);
      std::
      unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
                     *)&local_ad8);
    }
    target_00 = local_c00;
    std::__cxx11::string::string((string *)&local_b78,(string *)propName);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_b58,target_00,&local_b78,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)
               local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __return_storage_ptr__ = local_be0;
    std::__cxx11::string::~string((string *)&local_b78);
    std::__cxx11::string::string((string *)(local_bb0 + 0x18),(string *)cVar3.Value);
    cmGeneratorExpression::Parse(&local_bf8,(string *)local_bb0);
    std::__cxx11::string::~string((string *)(local_bb0 + 0x18));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad8,"try_compile_dummy_exe",(allocator<char> *)&local_bd8);
    mf = cmTarget::GetMakefile(local_c00->Target);
    cmTarget::cmTarget((cmTarget *)
                       &local_bf8.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(string *)&local_ad8,EXECUTABLE,Normal,mf,Yes);
    std::__cxx11::string::~string((string *)&local_ad8);
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(local_c00);
    cmGeneratorTarget::cmGeneratorTarget
              (&local_ad8,
               (cmTarget *)
               &local_bf8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pcVar5);
    pcVar4 = local_bf8.CMakeInstance;
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(local_c00);
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)pcVar4,pcVar5,&this->Config,&local_ad8,
                        &local_b58,local_c00,local_bd0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
    psVar1 = (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)&(local_bf8.CMakeInstance)->GeneratorPlatform;
    for (p_Var7 = (((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&(local_bf8.CMakeInstance)->GeneratorPlatform)->_M_t)._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      local_bd8 = *(cmGeneratorTarget **)(p_Var7 + 1);
      pVar8 = std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*const&>
                        ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                          *)emitted,&local_bd8);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,&local_bd8);
      }
    }
    cmGeneratorTarget::~cmGeneratorTarget(&local_ad8);
    cmTarget::~cmTarget((cmTarget *)
                        &local_bf8.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_bf8);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_b58);
    std::
    unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
    ::~unique_ptr((unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
                   *)&local_bf8.Backtrace);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_bb0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  cmValue prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge(*tgt->Makefile->GetCMakeInstance());

  std::unique_ptr<cmGeneratorExpressionDAGChecker> parentDagChecker;
  if (propName == "INTERFACE_LINK_OPTIONS") {
    // To please constraint checks of DAGChecker, this property must have
    // LINK_OPTIONS property as parent
    parentDagChecker = cm::make_unique<cmGeneratorExpressionDAGChecker>(
      tgt, "LINK_OPTIONS", nullptr, nullptr);
  }
  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr,
                                             parentDagChecker.get());

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::Visibility::Normal, tgt->Target->GetMakefile(),
                     cmTarget::PerConfig::Yes);

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     &gDummyHead, &dagChecker, tgt, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}